

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O3

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  uint64 uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint128 uVar21;
  
  uVar9 = seed.second;
  uVar10 = seed.first;
  if (len < 0x80) {
    if (len < 0x11) {
      uVar10 = (uVar10 * -0x4b6d499041670d8d >> 0x2f ^ uVar10 * -0x4b6d499041670d8d) *
               -0x4b6d499041670d8d;
      uVar4 = HashLen0to16(s,len);
      uVar5 = uVar4 + uVar9 * -0x4b6d499041670d8d;
      uVar6 = uVar5;
      if (7 < len) {
        uVar6 = *(ulong *)s;
      }
      uVar6 = uVar6 + uVar10 >> 0x2f ^ uVar6 + uVar10;
    }
    else {
      uVar6 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar10) * -0x622015f714c7d297;
      uVar6 = (uVar6 >> 0x2f ^ uVar10 ^ uVar6) * -0x622015f714c7d297;
      uVar12 = len + 0x10;
      uVar5 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
      uVar6 = (uVar9 + len ^ *(long *)(s + (len - 0x10)) + uVar5) * -0x622015f714c7d297;
      uVar6 = (uVar6 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar5 ^ uVar6) * -0x622015f714c7d297;
      uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
      uVar10 = uVar10 + uVar6;
      do {
        lVar7 = *(long *)s;
        plVar16 = (long *)((long)s + 8);
        s = (char *)((long)s + 0x10);
        uVar12 = uVar12 - 0x10;
        uVar10 = (((ulong)(lVar7 * -0x4b6d499041670d8d) >> 0x2f ^ lVar7 * -0x4b6d499041670d8d) *
                  -0x4b6d499041670d8d ^ uVar10) * -0x4b6d499041670d8d;
        uVar5 = (((ulong)(*plVar16 * -0x4b6d499041670d8d) >> 0x2f ^ *plVar16 * -0x4b6d499041670d8d)
                 * -0x4b6d499041670d8d ^ uVar5) * -0x4b6d499041670d8d;
        uVar9 = uVar9 ^ uVar10;
        uVar6 = uVar6 ^ uVar5;
      } while (0x20 < uVar12);
    }
    uVar12 = (uVar10 ^ uVar5) * -0x622015f714c7d297;
    uVar10 = (uVar6 ^ uVar9) * -0x622015f714c7d297;
    uVar6 = (uVar12 >> 0x2f ^ uVar5 ^ uVar12) * -0x622015f714c7d297;
    uVar9 = (uVar10 >> 0x2f ^ uVar9 ^ uVar10) * -0x622015f714c7d297;
    uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
    uVar10 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297 ^ uVar6;
    uVar9 = uVar10;
  }
  else {
    uVar17 = len * -0x4b6d499041670d8d;
    plVar16 = (long *)(s + 0x78);
    uVar12 = ((uVar9 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar9 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)s;
    uVar5 = (*(long *)(s + 0x58) + uVar10 >> 0x35 | (*(long *)(s + 0x58) + uVar10) * 0x800) *
            -0x4b6d499041670d8d;
    lVar7 = (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar6 = (uVar17 + uVar9 >> 0x23 | (uVar17 + uVar9) * 0x20000000) * -0x4b6d499041670d8d + uVar10;
    sVar14 = len;
    do {
      lVar8 = lVar7 * -0x4b6d499041670d8d + plVar16[-0xf];
      lVar18 = (uVar17 + uVar6 >> 0x21 | (uVar17 + uVar6) * 0x80000000) * -0x4b6d499041670d8d;
      uVar17 = uVar9 + lVar7 + plVar16[-9];
      uVar9 = uVar10 + uVar12 + uVar9 + plVar16[-0xe];
      uVar11 = plVar16[-0xe] + lVar8 + plVar16[-0xd];
      lVar15 = uVar12 + plVar16[-10] + (uVar17 >> 0x2a | uVar17 * 0x400000) * -0x4b6d499041670d8d;
      uVar10 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar5;
      lVar13 = uVar5 + lVar18 + plVar16[-0xb];
      uVar5 = plVar16[-10] + plVar16[-9] + lVar13;
      lVar7 = uVar11 + plVar16[-0xc];
      uVar9 = uVar6 + lVar8 + plVar16[-0xc] + uVar10;
      lVar19 = (uVar11 >> 0x2c | uVar11 * 0x100000) + lVar8 + (uVar9 >> 0x15 | uVar9 << 0x2b);
      uVar9 = lVar18 + lVar7 + plVar16[-6] + lVar15;
      uVar6 = plVar16[-0xd] + lVar13 + lVar15 + plVar16[-8];
      lVar8 = uVar5 + plVar16[-8];
      uVar10 = uVar10 + lVar8;
      uVar6 = (uVar5 >> 0x2c | uVar5 * 0x100000) + lVar13 + (uVar6 >> 0x15 | uVar6 << 0x2b);
      uVar10 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * -0x4b6d499041670d8d;
      uVar17 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar6;
      uVar9 = lVar15 + plVar16[-1] + lVar19;
      lVar13 = lVar19 * -0x4b6d499041670d8d + plVar16[-7];
      lVar15 = uVar6 + uVar10 + plVar16[-3];
      plVar1 = plVar16 + -5;
      uVar9 = lVar7 + plVar16[-2] + (uVar9 >> 0x2a | uVar9 * 0x400000) * -0x4b6d499041670d8d;
      uVar6 = lVar8 + uVar17 + plVar16[-4] + lVar13;
      uVar5 = plVar16[-2] + plVar16[-1] + lVar15;
      uVar11 = plVar16[-6] + *plVar1 + lVar13;
      uVar12 = uVar11 + plVar16[-4];
      sVar14 = sVar14 - 0x80;
      lVar8 = *plVar16;
      plVar16 = plVar16 + 0x10;
      lVar7 = (uVar11 >> 0x2c | uVar11 * 0x100000) + lVar13 + (uVar6 >> 0x15 | uVar6 << 0x2b);
      uVar6 = uVar5 + lVar8;
      uVar11 = *plVar1 + uVar9 + lVar8 + lVar15;
      uVar5 = (uVar5 >> 0x2c | uVar5 * 0x100000) + lVar15 + (uVar11 >> 0x15 | uVar11 << 0x2b);
    } while (0x7f < sVar14);
    uVar10 = (uVar12 + uVar17 >> 0x31 | (uVar12 + uVar17) * 0x8000) * -0x3c5a37a36834ced9 + uVar10;
    lVar8 = (uVar6 >> 0x25 | uVar6 * 0x8000000) * -0x3c5a37a36834ced9 + uVar17;
    if (sVar14 != 0) {
      plVar16 = (long *)(s + (len - 8));
      uVar17 = 0;
      do {
        plVar1 = plVar16 + -1;
        plVar2 = plVar16 + -3;
        lVar13 = *plVar16;
        lVar8 = lVar8 + uVar5;
        uVar5 = uVar5 + uVar12;
        uVar17 = uVar17 + 0x20;
        uVar6 = uVar6 + *plVar1;
        plVar3 = plVar16 + -2;
        lVar8 = lVar8 + *plVar2;
        uVar9 = (uVar9 + uVar10 >> 0x2a | (uVar9 + uVar10) * 0x400000) * -0x3c5a37a36834ced9 + lVar7
        ;
        plVar16 = plVar16 + -4;
        lVar15 = *plVar2 + uVar12 + lVar8;
        uVar10 = uVar10 * -0x3c5a37a36834ced9 + uVar6;
        uVar11 = lVar7 + lVar13 + lVar15;
        uVar20 = *plVar1 + *plVar3 + lVar15;
        uVar12 = uVar20 + lVar13;
        lVar7 = (uVar20 >> 0x2c | uVar20 * 0x100000) + lVar15 + (uVar11 >> 0x15 | uVar11 << 0x2b);
      } while (uVar17 < sVar14);
    }
    uVar10 = (uVar10 ^ uVar12) * -0x622015f714c7d297;
    uVar9 = (lVar8 + uVar9 ^ uVar6) * -0x622015f714c7d297;
    uVar10 = (uVar10 >> 0x2f ^ uVar12 ^ uVar10) * -0x622015f714c7d297;
    uVar9 = (uVar9 >> 0x2f ^ uVar6 ^ uVar9) * -0x622015f714c7d297;
    lVar8 = (uVar10 >> 0x2f ^ uVar10) * -0x622015f714c7d297;
    uVar9 = uVar9 >> 0x2f ^ uVar9;
    uVar10 = (lVar8 + lVar7 ^ uVar5) * -0x622015f714c7d297;
    uVar10 = (uVar10 >> 0x2f ^ uVar5 ^ uVar10) * -0x622015f714c7d297;
    uVar10 = ((uVar10 >> 0x2f ^ uVar10) + uVar9) * -0x622015f714c7d297;
    uVar6 = uVar9 * -0x622015f714c7d297 + lVar7;
    uVar9 = lVar8 + uVar5 ^ uVar6;
  }
  uVar9 = (uVar9 * -0x622015f714c7d297 >> 0x2f ^ uVar6 ^ uVar9 * -0x622015f714c7d297) *
          -0x622015f714c7d297;
  uVar21.second = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297;
  uVar21.first = uVar10;
  return uVar21;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  z += Rotate(w.first, 37) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}